

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Scene *scene;
  GeometricObject *this;
  GeometricObject *this_00;
  GeometricObject *this_01;
  GeometricObject *this_02;
  undefined8 *puVar10;
  SolidPtrList *this_03;
  Vector local_88;
  vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>> *local_70;
  Vector local_68;
  Vector local_48;
  
  scene = (Scene *)operator_new(0xe8);
  scene->_vptr_Scene = (_func_int **)&PTR__Scene_00108b60;
  (scene->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (scene->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (scene->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (scene->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (scene->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (scene->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (scene->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (scene->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (scene->eye).x = 0.0;
  (scene->eye).y = 0.0;
  (scene->eye).z = 0.0;
  (scene->eye_dir).x = 0.0;
  (scene->eye_dir).y = 0.0;
  (scene->eye_dir).z = 1.0;
  (scene->view_x).x = 1.0;
  (scene->view_x).y = 0.0;
  (scene->view_x).z = 0.0;
  (scene->view_y).x = 0.0;
  (scene->view_y).y = 1.0;
  (scene->view_y).z = 0.0;
  scene->aperture = 0.0;
  scene->focus = 0.0;
  (scene->ambient).z = 1.0;
  (scene->ambient).y = 1.0;
  (scene->ambient).x = 1.0;
  (scene->background).x = 0.0;
  (scene->background).y = 0.05;
  (scene->background).z = 0.05;
  this = (GeometricObject *)operator_new(200);
  GeometricObject::GeometricObject(this);
  this->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108c28;
  this[1]._vptr_GeometricObject = (_func_int **)0x0;
  this[1].def_material.ka = 1.0;
  this[1].def_material.kd = 5.0;
  this[1].def_material.ks = 1.5;
  this[1].def_material.kr = 2.25;
  this_00 = (GeometricObject *)operator_new(200);
  GeometricObject::GeometricObject(this_00);
  this_00->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108c28;
  this_00[1]._vptr_GeometricObject = (_func_int **)0xc008000000000000;
  this_00[1].def_material.ka = 0.0;
  this_00[1].def_material.kd = 4.0;
  this_00[1].def_material.ks = 1.0;
  this_00[1].def_material.kr = 1.0;
  this_01 = (GeometricObject *)operator_new(200);
  GeometricObject::GeometricObject(this_01);
  this_01->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108c28;
  this_01[1]._vptr_GeometricObject = (_func_int **)0x4008000000000000;
  this_01[1].def_material.ka = 0.0;
  this_01[1].def_material.kd = 4.0;
  this_01[1].def_material.ks = 1.0;
  this_01[1].def_material.kr = 1.0;
  this_02 = (GeometricObject *)operator_new(0xc0);
  GeometricObject::GeometricObject(this_02);
  local_70 = (vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>> *)
             &scene->light;
  this_02->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108be0;
  this_02[1]._vptr_GeometricObject = (_func_int **)0x0;
  this_02[1].def_material.ka = 1.0;
  this_02[1].def_material.kd = 0.0;
  this_02[1].def_material.ks = 1.0;
  (this->def_material).ka = 0.2;
  (this->def_material).kd = 0.5;
  (this->def_material).ks = 0.6;
  (this->def_material).kr = 0.0;
  (this->def_material).kt = 0.0;
  (this->def_material).p = 0x1e;
  (this->def_material).color.x = 1.0;
  (this->def_material).color.y = 1.0;
  (this->def_material).color.z = 0.0;
  dVar1 = Grayzer::Medium::glass.beta;
  (this->def_material).med.ior = Grayzer::Medium::glass.ior;
  (this->def_material).med.beta = dVar1;
  (this_00->def_material).kt = (this->def_material).kt;
  (this_00->def_material).ks = (this->def_material).ks;
  (this_00->def_material).kr = (this->def_material).kr;
  dVar1 = (this->def_material).kd;
  (this_00->def_material).ka = (this->def_material).ka;
  (this_00->def_material).kd = dVar1;
  dVar1 = (this->def_material).med.beta;
  (this_00->def_material).med.ior = (this->def_material).med.ior;
  (this_00->def_material).med.beta = dVar1;
  (this_00->def_material).p = (this->def_material).p;
  dVar1 = (this->def_material).n.x;
  dVar2 = (this->def_material).n.y;
  dVar3 = (this->def_material).n.z;
  dVar4 = (this->def_material).map_coord.x;
  dVar5 = (this->def_material).map_coord.y;
  dVar6 = (this->def_material).map_coord.z;
  (this_00->def_material).color.x = 1.0;
  (this_00->def_material).n.x = dVar1;
  (this_00->def_material).n.y = dVar2;
  (this_00->def_material).n.z = dVar3;
  (this_00->def_material).map_coord.x = dVar4;
  (this_00->def_material).map_coord.y = dVar5;
  (this_00->def_material).map_coord.z = dVar6;
  (this_00->def_material).color.y = 0.0;
  (this_00->def_material).color.z = 0.0;
  (this_01->def_material).kt = (this->def_material).kt;
  dVar7 = (this->def_material).ka;
  dVar8 = (this->def_material).kd;
  dVar9 = (this->def_material).kr;
  (this_01->def_material).ks = (this->def_material).ks;
  (this_01->def_material).kr = dVar9;
  (this_01->def_material).ka = dVar7;
  (this_01->def_material).kd = dVar8;
  dVar7 = (this->def_material).med.beta;
  (this_01->def_material).med.ior = (this->def_material).med.ior;
  (this_01->def_material).med.beta = dVar7;
  (this_01->def_material).p = (this->def_material).p;
  (this_01->def_material).n.x = dVar1;
  (this_01->def_material).n.y = dVar2;
  (this_01->def_material).n.z = dVar3;
  (this_01->def_material).map_coord.x = dVar4;
  (this_01->def_material).map_coord.y = dVar5;
  (this_01->def_material).map_coord.z = dVar6;
  (this_01->def_material).color.x = 0.0;
  (this_01->def_material).color.y = 0.0;
  (this_01->def_material).color.z = 1.0;
  (this_02->def_material).kt = (this->def_material).kt;
  dVar7 = (this->def_material).ka;
  dVar8 = (this->def_material).kd;
  dVar9 = (this->def_material).kr;
  (this_02->def_material).ks = (this->def_material).ks;
  (this_02->def_material).kr = dVar9;
  (this_02->def_material).ka = dVar7;
  (this_02->def_material).kd = dVar8;
  dVar7 = (this->def_material).med.beta;
  (this_02->def_material).med.ior = (this->def_material).med.ior;
  (this_02->def_material).med.beta = dVar7;
  (this_02->def_material).p = (this->def_material).p;
  (this_02->def_material).n.x = dVar1;
  (this_02->def_material).n.y = dVar2;
  (this_02->def_material).n.z = dVar3;
  (this_02->def_material).map_coord.x = dVar4;
  (this_02->def_material).map_coord.y = dVar5;
  (this_02->def_material).map_coord.z = dVar6;
  (this_02->def_material).ka = 0.1;
  (this_02->def_material).kd = 0.5;
  (this_02->def_material).ks = 0.4;
  (this_02->def_material).kr = 0.4;
  (this_02->def_material).color.x = 0.0;
  (this_02->def_material).color.y = 0.0;
  (this_02->def_material).color.z = 1.0;
  (this->def_material).kr = 0.3;
  puVar10 = (undefined8 *)operator_new(0x40);
  puVar10[3] = 0x3ff0000000000000;
  puVar10[2] = 0x3ff0000000000000;
  puVar10[1] = 0x3ff0000000000000;
  *puVar10 = &PTR__LightSource_00108c70;
  puVar10[4] = 0x4024000000000000;
  puVar10[5] = 0x4014000000000000;
  puVar10[6] = 0xc024000000000000;
  puVar10[7] = 0x4031000000000000;
  this_03 = &scene->solid;
  local_88.x = (double)this;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)this_03,(GeometricObject **)&local_88);
  local_88.x = (double)this_00;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)this_03,(GeometricObject **)&local_88);
  local_88.x = (double)this_01;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)this_03,(GeometricObject **)&local_88);
  local_88.x = (double)this_02;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)this_03,(GeometricObject **)&local_88);
  local_88.x = (double)puVar10;
  std::vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>>::
  emplace_back<LightSource*&>(local_70,(LightSource **)&local_88);
  (scene->background).x = 0.196078;
  (scene->background).y = 0.6;
  (scene->background).z = 0.8;
  local_88.z = 0.0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_68.z = 1.0;
  local_48.x = 0.0;
  local_48.y = 1.0;
  local_48.z = 0.0;
  Scene::setCamera(scene,&local_88,&local_68,&local_48);
  render_scene(scene,1.5,1.0,300,200,"SAMPLE30.TGA");
  distributed_render_scene(scene,1.5,1.0,300,200,5,5,"SAMPLE31.TGA");
  return 0;
}

Assistant:

int main()
{
    Sphere *s1,*s2,*s3;
    Plane *p;
    PointLight *Light1;

    Scene* scene = new Scene();
    s1 = new Sphere(Vector(0,1,5),1.5);
    s2 = new Sphere(Vector(-3,0,4),1);
    s3 = new Sphere(Vector(3,0,4),1);
    p = new Plane(Vector(0,1,0),1);
    s1->ambient(0.2);
    s1->diffuse(0.5);
    s1->specular(0.6);
    s1->reflection(0.0);
    s1->transmittance(0.0);
    s1->phong_size(30);
    s1->color(Yellow);
    s1->medium(Grayzer::Medium::glass);

    s2->surface_data(s1->surface_data());
    s2->color(Red);

    s3->surface_data(s1->surface_data());
    s3->color(Blue);

    p->surface_data(s1->surface_data());
    p->ambient(0.1);
    p->diffuse(0.5);
    p->specular(0.4);
    p->reflection(0.4);
    p->color(Blue);

    s1->reflection(0.3);

    Light1 = new PointLight(Vector(10,5,-10),17);
    scene->add(s1);
    scene->add(s2);
    scene->add(s3);
    scene->add(p);
    scene->add(Light1);
    scene->setBackground(SkyBlue);
    scene->setCamera(Vector(0),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.5,1.0,300,200,"SAMPLE30.TGA");
    distributed_render_scene(scene, 1.5,1.0,300,200,5,5,"SAMPLE31.TGA");
}